

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O3

double deranged_cdf(int x,int a)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int k;
  bool bVar9;
  double dVar10;
  
  dVar10 = 0.0;
  if (x <= a && -1 < x) {
    iVar7 = 0;
    iVar8 = a;
    k = 0;
    do {
      iVar1 = i4_choose(a,k);
      uVar4 = a - k;
      iVar3 = 0;
      if (-1 < (int)uVar4) {
        if (uVar4 < 3) {
          iVar3 = *(int *)(&DAT_0021f5b0 + (ulong)uVar4 * 4);
        }
        else {
          iVar5 = 2;
          iVar3 = 1;
          iVar6 = 0;
          do {
            iVar2 = iVar3;
            iVar3 = (iVar6 + iVar2) * iVar5;
            iVar5 = iVar5 + 1;
            iVar6 = iVar2;
          } while (iVar8 != iVar5);
        }
      }
      iVar7 = iVar7 + iVar3 * iVar1;
      iVar8 = iVar8 + -1;
      bVar9 = k != x;
      k = k + 1;
    } while (bVar9);
    dVar10 = r8_factorial(a);
    dVar10 = (double)iVar7 / dVar10;
  }
  return dVar10;
}

Assistant:

double deranged_cdf ( int x, int a )

//****************************************************************************80
//
//  Purpose:
//
//    DERANGED_CDF evaluates the Deranged CDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    13 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int X, the maximum number of items in their correct places.
//    0 <= X <= A.
//
//    Input, int A, the number of items.
//    1 <= A.
//
//    Output, double CDF, the value of the CDF.
//
{
  double cdf;
  int cnk;
  int dnmk;
  int sum2;
  int x2;

  if ( x < 0 || a < x )
  {
    cdf = 0.0;
  }
  else
  {
    sum2 = 0;
    for ( x2 = 0; x2 <= x; x2++ )
    {
      cnk = i4_choose ( a, x2 );
      dnmk = deranged_enum ( a - x2 );
      sum2 = sum2 + cnk * dnmk;
    }
    cdf = static_cast<double>(sum2 ) / r8_factorial ( a );
  }

  return cdf;
}